

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_byteStream_primitive_nextPutString
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sysbvm_byteStream_nextPutString(context,*arguments,arguments[1]);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteStream_primitive_nextPutString(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_byteStream_nextPutString(context, arguments[0], arguments[1]);
    return SYSBVM_VOID_TUPLE;
}